

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

void Cipher::translate(TClusterToLetterMap *clMap,TClusters *clusters,
                      vector<int,_std::allocator<int>_> *plain)

{
  pointer piVar1;
  mapped_type *__x;
  long lVar2;
  int i;
  long lVar3;
  
  piVar1 = (plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  lVar2 = 0;
  for (lVar3 = 0;
      piVar1 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      lVar3 < (int)((ulong)((long)(clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
      lVar3 = lVar3 + 1) {
    __x = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                    (clMap,(key_type *)((long)piVar1 + lVar2));
    std::vector<int,_std::allocator<int>_>::push_back(plain,__x);
    lVar2 = lVar2 + 4;
  }
  return;
}

Assistant:

void translate(
            const TClusterToLetterMap & clMap,
            const TClusters & clusters,
            std::vector<TLetter> & plain) {
        plain.clear();
        for (int i = 0; i < (int) clusters.size(); ++i) {
            plain.push_back(clMap.at(clusters[i]));
        }
    }